

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Metadata.cpp
# Opt level: O0

void __thiscall ASDCP::MXF::DMSegment::Dump(DMSegment *this,FILE *stream)

{
  undefined8 uVar1;
  bool bVar2;
  char *pcVar3;
  unsigned_long_long *puVar4;
  UTF16String *this_00;
  char local_98 [8];
  char identbuf [128];
  FILE *stream_local;
  DMSegment *this_local;
  
  local_98[0] = '\0';
  identbuf._120_8_ = stream;
  if (stream == (FILE *)0x0) {
    identbuf._120_8_ = _stderr;
  }
  InterchangeObject::Dump(&this->super_InterchangeObject,(FILE *)identbuf._120_8_);
  uVar1 = identbuf._120_8_;
  pcVar3 = UL::EncodeString(&this->DataDefinition,local_98,0x80);
  fprintf((FILE *)uVar1,"  %22s = %s\n","DataDefinition",pcVar3);
  bVar2 = optional_property<unsigned_long_long>::empty(&this->Duration);
  uVar1 = identbuf._120_8_;
  if (!bVar2) {
    puVar4 = optional_property<unsigned_long_long>::get(&this->Duration);
    pcVar3 = i64sz(*puVar4,local_98);
    fprintf((FILE *)uVar1,"  %22s = %s\n","Duration",pcVar3);
  }
  bVar2 = optional_property<unsigned_long_long>::empty(&this->EventStartPosition);
  uVar1 = identbuf._120_8_;
  if (!bVar2) {
    puVar4 = optional_property<unsigned_long_long>::get(&this->EventStartPosition);
    pcVar3 = i64sz(*puVar4,local_98);
    fprintf((FILE *)uVar1,"  %22s = %s\n","EventStartPosition",pcVar3);
  }
  bVar2 = optional_property<ASDCP::MXF::UTF16String>::empty(&this->EventComment);
  uVar1 = identbuf._120_8_;
  if (!bVar2) {
    this_00 = optional_property<ASDCP::MXF::UTF16String>::get(&this->EventComment);
    pcVar3 = UTF16String::EncodeString(this_00,local_98,0x80);
    fprintf((FILE *)uVar1,"  %22s = %s\n","EventComment",pcVar3);
  }
  uVar1 = identbuf._120_8_;
  pcVar3 = Kumu::UUID::EncodeString(&this->DMFramework,local_98,0x80);
  fprintf((FILE *)uVar1,"  %22s = %s\n","DMFramework",pcVar3);
  return;
}

Assistant:

void
DMSegment::Dump(FILE* stream)
{
  char identbuf[IdentBufferLen];
  *identbuf = 0;

  if ( stream == 0 )
    stream = stderr;

  InterchangeObject::Dump(stream);
  fprintf(stream, "  %22s = %s\n",  "DataDefinition", DataDefinition.EncodeString(identbuf, IdentBufferLen));
  if ( ! Duration.empty() ) {
    fprintf(stream, "  %22s = %s\n",  "Duration", i64sz(Duration.get(), identbuf));
  }
  if ( ! EventStartPosition.empty() ) {
    fprintf(stream, "  %22s = %s\n",  "EventStartPosition", i64sz(EventStartPosition.get(), identbuf));
  }
  if ( ! EventComment.empty() ) {
    fprintf(stream, "  %22s = %s\n",  "EventComment", EventComment.get().EncodeString(identbuf, IdentBufferLen));
  }
  fprintf(stream, "  %22s = %s\n",  "DMFramework", DMFramework.EncodeString(identbuf, IdentBufferLen));
}